

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O3

bool absl::lts_20250127::str_format_internal::(anonymous_namespace)::
     FloatToBuffer<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,long_double>
               (Decomposed<long_double> decomposed,size_t precision,Buffer *out,int *exp)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 digits [16];
  undefined1 digits_00 [16];
  char cVar5;
  size_t sVar6;
  ulong uVar7;
  byte bVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  byte bVar12;
  Buffer *pBVar13;
  Buffer *pBVar14;
  size_t sVar15;
  uint uVar16;
  Buffer *pBVar17;
  ulong uVar18;
  Buffer *pBVar19;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  undefined8 in_stack_ffffffffffffffb8;
  
  if (0x27 < precision) {
    return false;
  }
  out->end = out->data + 0x29;
  out->begin = out->data + 0x29;
  bVar8 = (byte)decomposed.exponent;
  if (decomposed.exponent < 0) {
    if ((uint)decomposed.exponent < 0xffffffc4) goto LAB_002cdde8;
    bVar8 = -bVar8;
    uVar20 = ~(-1L << (bVar8 & 0x3f));
    sVar15 = PrintIntegralDigits<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,unsigned_long>
                       (decomposed.mantissa.lo_ >> (bVar8 & 0x3f),out);
    uVar10 = decomposed.mantissa.lo_ & uVar20;
    if (sVar15 == 0) {
      *exp = 0;
      iVar9 = 0;
      if (uVar10 == 0) {
        uVar10 = 0;
      }
      else {
        do {
          uVar10 = uVar10 * 10;
          iVar9 = iVar9 + -1;
        } while (uVar10 <= uVar20);
        *exp = iVar9;
      }
      pBVar17 = (Buffer *)out->begin;
      if (pBVar17 <= out) goto LAB_002ce249;
      out->begin = (char *)((long)&pBVar17[-1].end + 7);
      *(char *)((long)&pBVar17[-1].end + 7) = (char)(uVar10 >> (bVar8 & 0x3f)) + '0';
      pcVar1 = out->end;
      if (&out->field_0x55 <= pcVar1) goto LAB_002ce22a;
      out->end = pcVar1 + 1;
      *pcVar1 = '.';
      uVar10 = uVar10 & uVar20;
    }
    else {
      uVar11 = sVar15 - 1;
      *exp = (int)uVar11;
      sVar15 = uVar11 - precision;
      if (precision <= uVar11 && sVar15 != 0) {
        bVar22 = uVar10 != 0;
        goto LAB_002cdf17;
      }
      precision = precision - uVar11;
    }
    if (precision != 0) {
      do {
        pcVar1 = out->end;
        if (&out->field_0x55 <= pcVar1) goto LAB_002ce22a;
        uVar11 = uVar10 * 10;
        uVar10 = uVar11 & uVar20;
        out->end = pcVar1 + 1;
        *pcVar1 = (char)(uVar11 >> (bVar8 & 0x3f)) + '0';
        precision = precision - 1;
      } while (precision != 0);
    }
    cVar5 = (char)(uVar10 * 10 >> (bVar8 & 0x3f));
    if (cVar5 < '\x06') {
      if (cVar5 != '\x05') {
        return true;
      }
      if ((uVar10 * 10 & uVar20) == 0) {
        cVar5 = out->end[-1];
        if (cVar5 == '.') {
          cVar5 = out->end[-2];
        }
joined_r0x002ce0d7:
        if (((int)cVar5 & 0x80000001U) != 1) {
          return true;
        }
      }
    }
LAB_002ce214:
    anon_unknown_0::
    RoundUp<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1>(out,exp)
    ;
  }
  else {
    if (decomposed.exponent == 0) {
      sVar6 = PrintIntegralDigits<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,unsigned_long>
                        (decomposed.mantissa.lo_,out);
      uVar10 = sVar6 - 1;
      *exp = (int)uVar10;
      sVar15 = uVar10 - precision;
      if (uVar10 < precision || sVar15 == 0) {
        if (sVar15 == 0) {
          return true;
        }
        lVar21 = ~precision + sVar6;
        while (pcVar1 = out->end, pcVar1 < &out->field_0x55) {
          out->end = pcVar1 + 1;
          *pcVar1 = '0';
          lVar21 = lVar21 + 1;
          if (lVar21 == 0) {
            return true;
          }
        }
        goto LAB_002ce22a;
      }
      bVar22 = false;
    }
    else {
LAB_002cdde8:
      if (decomposed.exponent < 0) {
        if ((uint)decomposed.exponent < 0xffffff84) {
          return false;
        }
        uVar16 = -decomposed.exponent;
        bVar8 = (byte)uVar16;
        pBVar19 = (Buffer *)(-1L << (bVar8 & 0x3f));
        pBVar13 = (Buffer *)(decomposed.mantissa.hi_ >> (bVar8 & 0x3f));
        bVar22 = (uVar16 & 0x40) != 0;
        pBVar14 = pBVar19;
        pBVar17 = (Buffer *)0xffffffffffffffff;
        if (bVar22) {
          pBVar14 = (Buffer *)0x0;
          pBVar17 = pBVar19;
        }
        uVar20 = ~(ulong)pBVar14;
        uVar10 = ~(ulong)pBVar17;
        pBVar14 = pBVar13;
        pBVar17 = (Buffer *)
                  (decomposed.mantissa.lo_ >> (bVar8 & 0x3f) |
                  decomposed.mantissa.hi_ << 0x40 - (bVar8 & 0x3f));
        if (bVar22) {
          pBVar14 = (Buffer *)0x0;
          pBVar17 = pBVar13;
        }
        digits_00._8_8_ = exp;
        digits_00._0_8_ = in_stack_ffffffffffffffb8;
        sVar15 = PrintIntegralDigits<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,unsigned__int128>
                           ((_anonymous_namespace_ *)pBVar17,(unsigned___int128)digits_00,pBVar14);
        uVar11 = decomposed.mantissa.hi_ & uVar10;
        uVar18 = decomposed.mantissa.lo_ & uVar20;
        if (sVar15 == 0) {
          *exp = 0;
          iVar9 = 0;
          if (uVar18 == 0 && uVar11 == 0) {
            uVar18 = 0;
            uVar11 = 0;
          }
          else {
            do {
              auVar2._8_8_ = 0;
              auVar2._0_8_ = uVar18;
              uVar18 = SUB168(auVar2 * ZEXT816(10),0);
              uVar11 = SUB168(auVar2 * ZEXT816(10),8) + uVar11 * 10;
              iVar9 = iVar9 + -1;
            } while (uVar11 <= uVar10 && (ulong)(uVar20 < uVar18) <= uVar10 - uVar11);
            *exp = iVar9;
          }
          pBVar17 = (Buffer *)out->begin;
          if (pBVar17 <= out) {
LAB_002ce249:
            __assert_fail("begin > data",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                          ,0x3ef,
                          "void absl::str_format_internal::(anonymous namespace)::Buffer::push_front(char)"
                         );
          }
          bVar12 = (byte)(uVar11 >> (bVar8 & 0x3f));
          if ((uVar16 & 0x40) == 0) {
            bVar12 = (byte)(uVar18 >> (bVar8 & 0x3f)) | (byte)(uVar11 << 0x40 - (bVar8 & 0x3f));
          }
          out->begin = (char *)((long)&pBVar17[-1].end + 7);
          *(byte *)((long)&pBVar17[-1].end + 7) = bVar12 + 0x30;
          pcVar1 = out->end;
          if (&out->field_0x55 <= pcVar1) goto LAB_002ce22a;
          out->end = pcVar1 + 1;
          *pcVar1 = '.';
          uVar18 = uVar18 & uVar20;
          uVar11 = uVar11 & uVar10;
        }
        else {
          uVar7 = sVar15 - 1;
          *exp = (int)uVar7;
          sVar15 = uVar7 - precision;
          if (precision <= uVar7 && sVar15 != 0) {
            bVar22 = uVar18 != 0 || uVar11 != 0;
            goto LAB_002cdf17;
          }
          precision = precision - uVar7;
        }
        if (precision != 0) {
          do {
            pcVar1 = out->end;
            if (&out->field_0x55 <= pcVar1) goto LAB_002ce22a;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = uVar18;
            uVar18 = SUB168(auVar3 * ZEXT816(10),0);
            uVar11 = SUB168(auVar3 * ZEXT816(10),8) + uVar11 * 10;
            bVar12 = (byte)(uVar11 >> (bVar8 & 0x3f));
            if ((uVar16 & 0x40) == 0) {
              bVar12 = (byte)(uVar18 >> (bVar8 & 0x3f)) | (byte)(uVar11 << 0x40 - (bVar8 & 0x3f));
            }
            uVar18 = uVar18 & uVar20;
            uVar11 = uVar11 & uVar10;
            out->end = pcVar1 + 1;
            *pcVar1 = bVar12 + 0x30;
            precision = precision - 1;
          } while (precision != 0);
        }
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar18;
        uVar18 = SUB168(auVar4 * ZEXT816(10),0);
        uVar11 = SUB168(auVar4 * ZEXT816(10),8) + uVar11 * 10;
        bVar12 = (byte)(uVar11 >> (bVar8 & 0x3f));
        if ((uVar16 & 0x40) == 0) {
          bVar12 = (byte)(uVar18 >> (bVar8 & 0x3f)) | (byte)(uVar11 << 0x40 - (bVar8 & 0x3f));
        }
        if ((char)bVar12 < '\x06') {
          if (bVar12 != 5) {
            return true;
          }
          if ((uVar11 & uVar10) == 0 && (uVar18 & uVar20) == 0) {
            cVar5 = out->end[-1];
            if (cVar5 == '.') {
              cVar5 = out->end[-2];
            }
            goto joined_r0x002ce0d7;
          }
        }
        goto LAB_002ce214;
      }
      if (0x40 < (uint)decomposed.exponent) {
        return false;
      }
      pBVar17 = (Buffer *)(decomposed.mantissa.lo_ << (bVar8 & 0x3f));
      pBVar14 = (Buffer *)0x0;
      if (((undefined1  [32])decomposed & (undefined1  [32])0x40) == (undefined1  [32])0x0) {
        pBVar14 = pBVar17;
        pBVar17 = (Buffer *)
                  (decomposed.mantissa.hi_ << (bVar8 & 0x3f) |
                  decomposed.mantissa.lo_ >> 0x40 - (bVar8 & 0x3f));
      }
      digits._8_8_ = exp;
      digits._0_8_ = in_stack_ffffffffffffffb8;
      sVar6 = PrintIntegralDigits<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,unsigned__int128>
                        ((_anonymous_namespace_ *)pBVar14,(unsigned___int128)digits,pBVar17);
      uVar10 = sVar6 - 1;
      *exp = (int)uVar10;
      sVar15 = uVar10 - precision;
      if (uVar10 < precision || sVar15 == 0) {
        if (sVar15 == 0) {
          return true;
        }
        lVar21 = ~precision + sVar6;
        while (pcVar1 = out->end, pcVar1 < &out->field_0x55) {
          out->end = pcVar1 + 1;
          *pcVar1 = '0';
          lVar21 = lVar21 + 1;
          if (lVar21 == 0) {
            return true;
          }
        }
LAB_002ce22a:
        __assert_fail("end < data + sizeof(data)",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                      ,0x3f3,
                      "void absl::str_format_internal::(anonymous namespace)::Buffer::push_back(char)"
                     );
      }
      bVar22 = false;
    }
LAB_002cdf17:
    anon_unknown_0::RemoveExtraPrecision(sVar15,bVar22,out,exp);
  }
  return true;
}

Assistant:

bool FloatToBuffer(Decomposed<Float> decomposed,
                   size_t precision,
                   Buffer* out,
                   int* exp) {
  if (precision > kMaxFixedPrecision) return false;

  // Try with uint64_t.
  if (CanFitMantissa<Float, std::uint64_t>() &&
      FloatToBufferImpl<std::uint64_t, Float, mode>(
          static_cast<std::uint64_t>(decomposed.mantissa), decomposed.exponent,
          precision, out, exp))
    return true;

#if defined(ABSL_HAVE_INTRINSIC_INT128)
  // If that is not enough, try with __uint128_t.
  return CanFitMantissa<Float, __uint128_t>() &&
         FloatToBufferImpl<__uint128_t, Float, mode>(
             static_cast<__uint128_t>(decomposed.mantissa), decomposed.exponent,
             precision, out, exp);
#endif
  return false;
}